

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowValueGlobalState::WindowValueGlobalState
          (WindowValueGlobalState *this,WindowValueExecutor *executor,idx_t payload_count,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  _Head_base<0UL,_duckdb::WindowIndexTree_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowIndexTree_*,_false> _Var2;
  _Head_base<0UL,_duckdb::WindowIndexTree_*,_false> local_28;
  idx_t local_20;
  
  local_20 = payload_count;
  WindowExecutorGlobalState::WindowExecutorGlobalState
            (&this->super_WindowExecutorGlobalState,&executor->super_WindowExecutor,payload_count,
             partition_mask,order_mask);
  (this->super_WindowExecutorGlobalState).super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowValueGlobalState_017aa7f0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->all_valid).super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  (this->all_valid).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->all_valid).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->all_valid).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  (this->ignore_nulls).ptr = &this->all_valid;
  this->child_idx = executor->child_idx;
  (this->value_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl = (WindowIndexTree *)0x0;
  if ((executor->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (executor->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    make_uniq<duckdb::WindowIndexTree,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>const&,duckdb::vector<unsigned_long,true>const&,unsigned_long_const&>
              ((duckdb *)&local_28,(executor->super_WindowExecutor).context,
               &((executor->super_WindowExecutor).wexpr)->arg_orders,&executor->arg_order_idx,
               &local_20);
    _Var2._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (WindowIndexTree *)0x0;
    _Var1._M_head_impl =
         (this->value_tree).
         super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
         .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl;
    (this->value_tree).
    super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
    .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (WindowIndexTree *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WindowMergeSortTree + 8))();
      if (local_28._M_head_impl != (WindowIndexTree *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
  }
  return;
}

Assistant:

WindowValueGlobalState(const WindowValueExecutor &executor, const idx_t payload_count,
	                       const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowExecutorGlobalState(executor, payload_count, partition_mask, order_mask), ignore_nulls(&all_valid),
	      child_idx(executor.child_idx) {

		if (!executor.arg_order_idx.empty()) {
			value_tree = make_uniq<WindowIndexTree>(executor.context, executor.wexpr.arg_orders, executor.arg_order_idx,
			                                        payload_count);
		}
	}